

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<char[7],double>
          (Capturer *this,size_t index,char (*value) [7],double *values)

{
  string local_48;
  double *local_28;
  double *values_local;
  char (*value_local) [7];
  size_t index_local;
  Capturer *this_local;
  
  local_28 = values;
  values_local = (double *)value;
  value_local = (char (*) [7])index;
  index_local = (size_t)this;
  Detail::stringify<char[7]>(&local_48,value);
  captureValue(this,index,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  captureValues<double>(this,(size_t)(*value_local + 1),local_28);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }